

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_1::RecoverFromResetCase::iterate(RecoverFromResetCase *this)

{
  EGLConfig *config;
  EGLDisplay *display;
  ostringstream *poVar1;
  ShaderType SVar2;
  EglTestContext *pEVar3;
  GLenum err;
  InfiniteLoop *this_00;
  EGLint attribList [9];
  RenderingContext contextA;
  RenderingContext contextB;
  Functions gl;
  EGLContext local_1c58 [4];
  EGLint local_1c38 [12];
  RenderingContext local_1c08;
  undefined1 local_1bd8 [120];
  ios_base local_1b60 [264];
  undefined1 local_1a58 [120];
  ios_base local_19e0 [6576];
  
  pEVar3 = (EglTestContext *)
           ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = (ostringstream *)(local_1a58 + 8);
  local_1a58._0_8_ = pEVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Destroy the old context and successfully create a new context.\n\n",
             0x40);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19e0);
  local_1c38[4] = 0x30bf;
  local_1c38[5] = 1;
  local_1c38[6] = 0x3138;
  local_1c38[7] = 0x31bf;
  local_1c38[0] = 0x3098;
  local_1c38[1] = 3;
  local_1c38[2] = 0x30fb;
  local_1c38[3] = 1;
  local_1c38[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1c38);
  poVar1 = (ostringstream *)(local_1a58 + 8);
  local_1a58._0_8_ = pEVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Create context A",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19e0);
  config = &(this->super_RobustnessTestCase).m_eglConfig;
  display = &(this->super_RobustnessTestCase).m_eglDisplay;
  local_1a58._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1c08,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1c38,
             config,display,(EGLContext *)local_1a58);
  RenderingContext::makeCurrent
            (&local_1c08,(EGLSurface *)(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)local_1a58);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_1c08.m_eglTestCtx,(Functions *)local_1c08.m_attribList);
  checkRequiredGLRobustnessExtension(local_1c38,(Functions *)local_1a58);
  this_00 = (InfiniteLoop *)operator_new(0x48);
  SVar2 = (this->super_RobustnessTestCase).m_params.m_shaderType;
  (this_00->super_ContextReset).m_gl = (Functions *)local_1a58;
  (this_00->super_ContextReset).m_log = (TestLog *)pEVar3;
  (this_00->super_ContextReset).m_shaderType = SVar2;
  (this_00->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_021108e0;
  this_00->m_outputBuffer = 0;
  this_00->m_coordinatesBuffer = 0;
  this_00->m_coordLocation = 0;
  InfiniteLoop::setup(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[3])(this_00);
  (*(this_00->super_ContextReset)._vptr_ContextReset[4])(this_00);
  (*((this_00->super_ContextReset).m_gl)->finish)();
  err = (*((this_00->super_ContextReset).m_gl)->getError)();
  glu::checkError(err,"finish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x279);
  poVar1 = (ostringstream *)(local_1bd8 + 8);
  local_1bd8._0_8_ = pEVar3;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Create context B",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1b60);
  local_1c58[0] = (EGLContext)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_1bd8,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1c38,config,display,
             local_1c58);
  RenderingContext::~RenderingContext((RenderingContext *)local_1bd8);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  (*(this_00->super_ContextReset)._vptr_ContextReset[1])(this_00);
  RenderingContext::~RenderingContext(&local_1c08);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
			<< "Destroy the old context and successfully create a new context.\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		log << tcu::TestLog::Message << "Create context A" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				const glw::GLint status = gl.getGraphicsResetStatus();
				if (status == GL_NO_ERROR)
				{
					log << tcu::TestLog::Message
						<< "Test failed! glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_GUILTY_CONTEXT_RESET) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}

				const int	sleepTimeMs		= 1000;				// (1 second)
				int			timeout			= sleepTimeMs * 10; // (10 seconds)
				int			reset_status	= -1;

				// wait for context to reset
				while ((reset_status = gl.getGraphicsResetStatus() != GL_NO_ERROR) && timeout > 0)
				{
					deSleep(sleepTimeMs);
					timeout -= sleepTimeMs;
				}

				if (reset_status != GL_NO_ERROR)
				{
					log	<< tcu::TestLog::Message
						<< "Test failed! Context did not reset. glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(reset_status) << ", expected " << glu::getErrorStr(GL_NO_ERROR) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		try
		{
			log << tcu::TestLog::Message << "Create context B" << tcu::TestLog::EndMessage;
			RenderingContext contextB(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		}
		catch (const glu::Error&)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! Could not create new context. glGetError() returned wrong value. Expected GL_NO_ERROR");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}